

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-literal.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_b35c3::AssertUint128Equals(anon_unknown_dwarf_b35c3 *this,v128 expected,char *s)

{
  long lVar1;
  bool bVar2;
  size_t sVar3;
  char *pcVar4;
  AssertionResult gtest_ar;
  v128 actual;
  Message local_58;
  internal local_50 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  AssertHelper local_40;
  anon_unknown_dwarf_b35c3 *local_38;
  uint8_t local_30 [8];
  v128 local_28;
  
  pcVar4 = expected.v._8_8_;
  local_30 = expected.v._0_8_;
  local_38 = this;
  sVar3 = strlen(pcVar4);
  local_58.ss_.ptr_._0_4_ = 0;
  local_40.data_._0_4_ = wabt::ParseUint128(pcVar4,pcVar4 + sVar3,&local_28);
  testing::internal::CmpHelperEQ<wabt::Result::Enum,wabt::Result>
            (local_50,"Result::Ok","ParseUint128(s, end, &actual)",(Enum *)&local_58,
             (Result *)&local_40);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message(&local_58);
    lVar1 = CONCAT44(local_58.ss_.ptr_._4_4_,local_58.ss_.ptr_._0_4_);
    if (pcVar4 == (char *)0x0) {
      pcVar4 = "(null)";
      sVar3 = 6;
    }
    else {
      sVar3 = strlen(pcVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(lVar1 + 0x10),pcVar4,sVar3);
    if (local_48.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_48.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/test-literal.cc"
               ,0x5e,pcVar4);
    testing::internal::AssertHelper::operator=(&local_40,&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (((CONCAT44(local_58.ss_.ptr_._4_4_,local_58.ss_.ptr_._0_4_) != 0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       ((long *)CONCAT44(local_58.ss_.ptr_._4_4_,local_58.ss_.ptr_._0_4_) != (long *)0x0)) {
      (**(code **)(*(long *)CONCAT44(local_58.ss_.ptr_._4_4_,local_58.ss_.ptr_._0_4_) + 8))();
    }
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    testing::internal::CmpHelperEQ<v128,v128>
              (local_50,"expected","actual",(v128 *)&local_38,&local_28);
    if (local_50[0] == (internal)0x0) {
      testing::Message::Message(&local_58);
      if (local_48.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((local_48.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_40,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/test-literal.cc"
                 ,0x5f,pcVar4);
      testing::internal::AssertHelper::operator=(&local_40,&local_58);
      testing::internal::AssertHelper::~AssertHelper(&local_40);
      if (((CONCAT44(local_58.ss_.ptr_._4_4_,local_58.ss_.ptr_._0_4_) != 0) &&
          (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
         ((long *)CONCAT44(local_58.ss_.ptr_._4_4_,local_58.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_58.ss_.ptr_._4_4_,local_58.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

void AssertUint128Equals(v128 expected,
                         const char* s) {
  const char* const end = s + strlen(s);
  v128 actual;
  ASSERT_EQ(Result::Ok, ParseUint128(s, end, &actual)) << s;
  ASSERT_EQ(expected, actual);
}